

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_ref_get_length_in_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 *pLength)

{
  ma_uint64 *pLength_local;
  ma_audio_buffer_ref *pAudioBufferRef_local;
  ma_result local_4;
  
  if (pLength == (ma_uint64 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *pLength = 0;
    if (pAudioBufferRef == (ma_audio_buffer_ref *)0x0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      *pLength = pAudioBufferRef->sizeInFrames;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_get_length_in_pcm_frames(const ma_audio_buffer_ref* pAudioBufferRef, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = pAudioBufferRef->sizeInFrames;

    return MA_SUCCESS;
}